

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 (*pauVar48) [16];
  size_t sVar49;
  RayHitK<8> *pRVar50;
  int iVar51;
  undefined4 uVar52;
  uint uVar53;
  uint uVar54;
  AABBNodeMB4D *node1;
  ulong uVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  vint4 ai;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar98;
  vint4 ai_4;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar99;
  undefined1 auVar97 [32];
  float fVar103;
  float fVar109;
  float fVar110;
  vint4 bi;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  vint4 ai_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  vint4 bi_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar153;
  float fVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar155;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar158 [32];
  float fVar163;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar170;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  vint4 bi_2;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1699;
  undefined1 (*local_1698) [16];
  ulong local_1690;
  long local_1688;
  ulong local_1680;
  uint local_1678;
  uint local_1674;
  ulong local_1670;
  ulong local_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1630 [16];
  int local_1620;
  int iStack_161c;
  int iStack_1618;
  int iStack_1614;
  long local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  long local_15d8;
  ulong local_15d0;
  size_t local_15c8;
  RayHitK<8> *local_15c0;
  long local_15b8;
  long local_15b0;
  Scene *local_15a8;
  undefined1 local_15a0 [32];
  RTCFilterFunctionNArguments local_1570;
  undefined1 local_1540 [32];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  int local_14b0;
  int iStack_14ac;
  int iStack_14a8;
  int iStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 *local_1380;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [8];
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1698 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_14c0._4_4_ = uVar52;
  local_14c0._0_4_ = uVar52;
  local_14c0._8_4_ = uVar52;
  local_14c0._12_4_ = uVar52;
  auVar136 = ZEXT1664(local_14c0);
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_14d0._4_4_ = uVar52;
  local_14d0._0_4_ = uVar52;
  local_14d0._8_4_ = uVar52;
  local_14d0._12_4_ = uVar52;
  auVar143 = ZEXT1664(local_14d0);
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1630._4_4_ = uVar52;
  local_1630._0_4_ = uVar52;
  local_1630._8_4_ = uVar52;
  local_1630._12_4_ = uVar52;
  auVar129 = ZEXT1664(local_1630);
  fStack_1474 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1484 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_1494 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fStack_14d4 = fStack_1474 * 0.99999964;
  fStack_14e4 = fStack_1484 * 0.99999964;
  fStack_1464 = fStack_1494 * 0.99999964;
  fStack_1474 = fStack_1474 * 1.0000004;
  fStack_1484 = fStack_1484 * 1.0000004;
  fStack_1494 = fStack_1494 * 1.0000004;
  local_15e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_15f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_15f8 = local_15e0 ^ 0x10;
  local_1600 = local_15e8 ^ 0x10;
  local_1608 = local_15f0 ^ 0x10;
  iStack_14a4 = (tray->tnear).field_0.i[k];
  iStack_1614 = (tray->tfar).field_0.i[k];
  local_1240._16_16_ = mm_lookupmask_ps._240_16_;
  local_1240._0_16_ = mm_lookupmask_ps._0_16_;
  iVar51 = 1 << ((uint)k & 0x1f);
  auVar67._4_4_ = iVar51;
  auVar67._0_4_ = iVar51;
  auVar67._8_4_ = iVar51;
  auVar67._12_4_ = iVar51;
  auVar67._16_4_ = iVar51;
  auVar67._20_4_ = iVar51;
  auVar67._24_4_ = iVar51;
  auVar67._28_4_ = iVar51;
  auVar68 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar67 = vpand_avx2(auVar67,auVar68);
  local_1280 = vpcmpeqd_avx2(auVar67,auVar68);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = &DAT_3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar81._16_4_ = 0x3f800000;
  auVar81._20_4_ = 0x3f800000;
  auVar81._24_4_ = 0x3f800000;
  auVar81._28_4_ = 0x3f800000;
  auVar68._8_4_ = 0xbf800000;
  auVar68._0_8_ = 0xbf800000bf800000;
  auVar68._12_4_ = 0xbf800000;
  auVar68._16_4_ = 0xbf800000;
  auVar68._20_4_ = 0xbf800000;
  auVar68._24_4_ = 0xbf800000;
  auVar68._28_4_ = 0xbf800000;
  _local_1260 = vblendvps_avx(auVar81,auVar68,local_1240);
  fStack_1468 = fStack_1464;
  fStack_146c = fStack_1464;
  local_1470 = fStack_1464;
  fStack_1478 = fStack_1474;
  fStack_147c = fStack_1474;
  local_1480 = fStack_1474;
  fStack_1488 = fStack_1484;
  fStack_148c = fStack_1484;
  local_1490 = fStack_1484;
  fStack_1498 = fStack_1494;
  fStack_149c = fStack_1494;
  local_14a0 = fStack_1494;
  iStack_14a8 = iStack_14a4;
  iStack_14ac = iStack_14a4;
  local_14b0 = iStack_14a4;
  fStack_14d8 = fStack_14d4;
  fStack_14dc = fStack_14d4;
  local_14e0 = fStack_14d4;
  fStack_14e8 = fStack_14e4;
  fStack_14ec = fStack_14e4;
  local_14f0 = fStack_14e4;
  local_15c0 = ray;
  local_15c8 = k;
  iStack_1618 = iStack_1614;
  iStack_161c = iStack_1614;
  local_1620 = iStack_1614;
  fVar154 = fStack_14e4;
  fVar153 = fStack_14e4;
  fVar155 = fStack_14e4;
  fVar161 = fStack_14e4;
  fVar98 = fStack_14d4;
  fVar99 = fStack_14d4;
  fVar100 = fStack_14d4;
  fVar101 = fStack_14d4;
  while (local_1698 != (undefined1 (*) [16])&local_fa0) {
    pauVar48 = local_1698 + -1;
    local_1698 = local_1698 + -1;
    if (*(float *)(*pauVar48 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      local_1670 = *(ulong *)*local_1698;
      do {
        if ((local_1670 & 8) == 0) {
          uVar55 = local_1670 & 0xfffffffffffffff0;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar62._4_4_ = uVar52;
          auVar62._0_4_ = uVar52;
          auVar62._8_4_ = uVar52;
          auVar62._12_4_ = uVar52;
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_15e0),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_15e0));
          auVar64 = vsubps_avx(auVar64,auVar136._0_16_);
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_15e8),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_15e8));
          auVar76._0_4_ = fVar101 * auVar64._0_4_;
          auVar76._4_4_ = fVar100 * auVar64._4_4_;
          auVar76._8_4_ = fVar99 * auVar64._8_4_;
          auVar76._12_4_ = fVar98 * auVar64._12_4_;
          auVar64 = vsubps_avx(auVar63,auVar143._0_16_);
          auVar88._0_4_ = fVar161 * auVar64._0_4_;
          auVar88._4_4_ = fVar155 * auVar64._4_4_;
          auVar88._8_4_ = fVar153 * auVar64._8_4_;
          auVar88._12_4_ = fVar154 * auVar64._12_4_;
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_15f0),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_15f0));
          auVar64 = vsubps_avx(auVar64,auVar129._0_16_);
          auVar104._0_4_ = auVar64._0_4_ * local_1470;
          auVar104._4_4_ = auVar64._4_4_ * fStack_146c;
          auVar104._8_4_ = auVar64._8_4_ * fStack_1468;
          auVar104._12_4_ = auVar64._12_4_ * fStack_1464;
          auVar64 = vmaxps_avx(auVar88,auVar104);
          auVar63._4_4_ = iStack_14ac;
          auVar63._0_4_ = local_14b0;
          auVar63._8_4_ = iStack_14a8;
          auVar63._12_4_ = iStack_14a4;
          auVar63 = vmaxps_avx(auVar63,auVar76);
          auVar64 = vmaxps_avx(auVar63,auVar64);
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_15f8),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_15f8));
          auVar63 = vsubps_avx(auVar63,auVar136._0_16_);
          auVar89._0_4_ = auVar63._0_4_ * local_1480;
          auVar89._4_4_ = auVar63._4_4_ * fStack_147c;
          auVar89._8_4_ = auVar63._8_4_ * fStack_1478;
          auVar89._12_4_ = auVar63._12_4_ * fStack_1474;
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_1600),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_1600));
          auVar63 = vsubps_avx(auVar63,auVar143._0_16_);
          auVar105._0_4_ = auVar63._0_4_ * local_1490;
          auVar105._4_4_ = auVar63._4_4_ * fStack_148c;
          auVar105._8_4_ = auVar63._8_4_ * fStack_1488;
          auVar105._12_4_ = auVar63._12_4_ * fStack_1484;
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar55 + 0x80 + local_1608),auVar62,
                                    *(undefined1 (*) [16])(uVar55 + 0x20 + local_1608));
          auVar63 = vsubps_avx(auVar63,auVar129._0_16_);
          auVar115._0_4_ = auVar63._0_4_ * local_14a0;
          auVar115._4_4_ = auVar63._4_4_ * fStack_149c;
          auVar115._8_4_ = auVar63._8_4_ * fStack_1498;
          auVar115._12_4_ = auVar63._12_4_ * fStack_1494;
          auVar63 = vminps_avx(auVar105,auVar115);
          auVar10._4_4_ = iStack_161c;
          auVar10._0_4_ = local_1620;
          auVar10._8_4_ = iStack_1618;
          auVar10._12_4_ = iStack_1614;
          auVar10 = vminps_avx(auVar10,auVar89);
          auVar63 = vminps_avx(auVar10,auVar63);
          if (((uint)local_1670 & 7) == 6) {
            auVar10 = vcmpps_avx(auVar64,auVar63,2);
            auVar63 = vcmpps_avx(*(undefined1 (*) [16])(uVar55 + 0xe0),auVar62,2);
            auVar62 = vcmpps_avx(auVar62,*(undefined1 (*) [16])(uVar55 + 0xf0),1);
            auVar63 = vandps_avx(auVar63,auVar62);
            auVar63 = vandps_avx(auVar63,auVar10);
          }
          else {
            auVar63 = vcmpps_avx(auVar64,auVar63,2);
          }
          auVar63 = vpslld_avx(auVar63,0x1f);
          uVar52 = vmovmskps_avx(auVar63);
          local_15d0 = CONCAT44((int)(uVar55 >> 0x20),uVar52);
          local_13e0._0_16_ = auVar64;
        }
        if ((local_1670 & 8) == 0) {
          if (local_15d0 == 0) {
            iVar51 = 4;
          }
          else {
            uVar58 = local_1670 & 0xfffffffffffffff0;
            lVar16 = 0;
            for (uVar55 = local_15d0; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000)
            {
              lVar16 = lVar16 + 1;
            }
            iVar51 = 0;
            uVar55 = local_15d0 - 1 & local_15d0;
            local_1670 = *(ulong *)(uVar58 + lVar16 * 8);
            if (uVar55 != 0) {
              uVar53 = *(uint *)(local_13e0 + lVar16 * 4);
              lVar16 = 0;
              for (uVar59 = uVar55; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar55 = uVar55 - 1 & uVar55;
              uVar59 = *(ulong *)(uVar58 + lVar16 * 8);
              uVar54 = *(uint *)(local_13e0 + lVar16 * 4);
              if (uVar55 == 0) {
                if (uVar53 < uVar54) {
                  *(ulong *)*local_1698 = uVar59;
                  *(uint *)(*local_1698 + 8) = uVar54;
                  local_1698 = local_1698 + 1;
                }
                else {
                  *(ulong *)*local_1698 = local_1670;
                  *(uint *)(*local_1698 + 8) = uVar53;
                  local_1670 = uVar59;
                  local_1698 = local_1698 + 1;
                }
              }
              else {
                auVar64._8_8_ = 0;
                auVar64._0_8_ = local_1670;
                auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar53));
                auVar77._8_8_ = 0;
                auVar77._0_8_ = uVar59;
                auVar63 = vpunpcklqdq_avx(auVar77,ZEXT416(uVar54));
                lVar16 = 0;
                for (uVar59 = uVar55; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
                uVar55 = uVar55 - 1 & uVar55;
                auVar90._8_8_ = 0;
                auVar90._0_8_ = *(ulong *)(uVar58 + lVar16 * 8);
                auVar62 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_13e0 + lVar16 * 4)));
                auVar10 = vpcmpgtd_avx(auVar63,auVar64);
                if (uVar55 == 0) {
                  auVar76 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar63,auVar64,auVar76);
                  auVar64 = vblendvps_avx(auVar64,auVar63,auVar76);
                  auVar63 = vpcmpgtd_avx(auVar62,auVar10);
                  auVar76 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar62,auVar10,auVar76);
                  auVar10 = vblendvps_avx(auVar10,auVar62,auVar76);
                  auVar62 = vpcmpgtd_avx(auVar10,auVar64);
                  auVar76 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar10,auVar64,auVar76);
                  auVar64 = vblendvps_avx(auVar64,auVar10,auVar76);
                  *local_1698 = auVar64;
                  local_1698[1] = auVar62;
                  local_1670 = auVar63._0_8_;
                  local_1698 = local_1698 + 2;
                }
                else {
                  lVar16 = 0;
                  for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                    lVar16 = lVar16 + 1;
                  }
                  auVar116._8_8_ = 0;
                  auVar116._0_8_ = *(ulong *)(uVar58 + lVar16 * 8);
                  auVar88 = vpunpcklqdq_avx(auVar116,ZEXT416(*(uint *)(local_13e0 + lVar16 * 4)));
                  auVar76 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar63,auVar64,auVar76);
                  auVar64 = vblendvps_avx(auVar64,auVar63,auVar76);
                  auVar63 = vpcmpgtd_avx(auVar88,auVar62);
                  auVar76 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar88,auVar62,auVar76);
                  auVar62 = vblendvps_avx(auVar62,auVar88,auVar76);
                  auVar76 = vpcmpgtd_avx(auVar62,auVar64);
                  auVar88 = vpshufd_avx(auVar76,0xaa);
                  auVar76 = vblendvps_avx(auVar62,auVar64,auVar88);
                  auVar64 = vblendvps_avx(auVar64,auVar62,auVar88);
                  auVar62 = vpcmpgtd_avx(auVar63,auVar10);
                  auVar88 = vpshufd_avx(auVar62,0xaa);
                  auVar62 = vblendvps_avx(auVar63,auVar10,auVar88);
                  auVar63 = vblendvps_avx(auVar10,auVar63,auVar88);
                  auVar10 = vpcmpgtd_avx(auVar76,auVar63);
                  auVar88 = vpshufd_avx(auVar10,0xaa);
                  auVar10 = vblendvps_avx(auVar76,auVar63,auVar88);
                  auVar63 = vblendvps_avx(auVar63,auVar76,auVar88);
                  *local_1698 = auVar64;
                  local_1698[1] = auVar63;
                  local_1698[2] = auVar10;
                  auVar129 = ZEXT1664(local_1630);
                  local_1670 = auVar62._0_8_;
                  local_1698 = local_1698 + 3;
                }
              }
            }
          }
        }
        else {
          iVar51 = 6;
        }
      } while (iVar51 == 0);
      if (iVar51 == 6) {
        local_1610 = (ulong)((uint)local_1670 & 0xf) - 8;
        if (local_1610 != 0) {
          local_1670 = local_1670 & 0xfffffffffffffff0;
          local_15d8 = 0;
          do {
            local_1688 = local_15d8 * 0x90;
            uVar55 = *(ulong *)(local_1670 + 0x20 + local_1688);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uVar55;
            auVar64 = vpmovzxbd_avx(auVar65);
            auVar64 = vcvtdq2ps_avx(auVar64);
            uVar52 = *(undefined4 *)(local_1670 + 0x44 + local_1688);
            auVar130._4_4_ = uVar52;
            auVar130._0_4_ = uVar52;
            auVar130._8_4_ = uVar52;
            auVar130._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x38 + local_1688);
            auVar137._4_4_ = uVar52;
            auVar137._0_4_ = uVar52;
            auVar137._8_4_ = uVar52;
            auVar137._12_4_ = uVar52;
            auVar10 = vfmadd213ps_fma(auVar64,auVar130,auVar137);
            auVar117._8_8_ = 0;
            auVar117._0_8_ = *(ulong *)(local_1670 + 0x50 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar117);
            auVar64 = vcvtdq2ps_avx(auVar64);
            uVar52 = *(undefined4 *)(local_1670 + 0x74 + local_1688);
            auVar144._4_4_ = uVar52;
            auVar144._0_4_ = uVar52;
            auVar144._8_4_ = uVar52;
            auVar144._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x68 + local_1688);
            auVar148._4_4_ = uVar52;
            auVar148._0_4_ = uVar52;
            auVar148._8_4_ = uVar52;
            auVar148._12_4_ = uVar52;
            auVar62 = vfmadd213ps_fma(auVar64,auVar144,auVar148);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = *(ulong *)(local_1670 + 0x24 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar78);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar76 = vfmadd213ps_fma(auVar64,auVar130,auVar137);
            auVar131._8_8_ = 0;
            auVar131._0_8_ = *(ulong *)(local_1670 + 0x54 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar131);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar88 = vfmadd213ps_fma(auVar64,auVar144,auVar148);
            auVar138._8_8_ = 0;
            auVar138._0_8_ = *(ulong *)(local_1670 + 0x28 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar138);
            auVar64 = vcvtdq2ps_avx(auVar64);
            uVar52 = *(undefined4 *)(local_1670 + 0x48 + local_1688);
            auVar156._4_4_ = uVar52;
            auVar156._0_4_ = uVar52;
            auVar156._8_4_ = uVar52;
            auVar156._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x3c + local_1688);
            auVar167._4_4_ = uVar52;
            auVar167._0_4_ = uVar52;
            auVar167._8_4_ = uVar52;
            auVar167._12_4_ = uVar52;
            auVar89 = vfmadd213ps_fma(auVar64,auVar156,auVar167);
            auVar145._8_8_ = 0;
            auVar145._0_8_ = *(ulong *)(local_1670 + 0x58 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar145);
            auVar64 = vcvtdq2ps_avx(auVar64);
            uVar52 = *(undefined4 *)(local_1670 + 0x78 + local_1688);
            auVar171._4_4_ = uVar52;
            auVar171._0_4_ = uVar52;
            auVar171._8_4_ = uVar52;
            auVar171._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x6c + local_1688);
            auVar187._4_4_ = uVar52;
            auVar187._0_4_ = uVar52;
            auVar187._8_4_ = uVar52;
            auVar187._12_4_ = uVar52;
            auVar104 = vfmadd213ps_fma(auVar64,auVar171,auVar187);
            auVar149._8_8_ = 0;
            auVar149._0_8_ = *(ulong *)(local_1670 + 0x2c + local_1688);
            auVar64 = vpmovzxbd_avx(auVar149);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar105 = vfmadd213ps_fma(auVar64,auVar156,auVar167);
            auVar157._8_8_ = 0;
            auVar157._0_8_ = *(ulong *)(local_1670 + 0x5c + local_1688);
            auVar64 = vpmovzxbd_avx(auVar157);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar115 = vfmadd213ps_fma(auVar64,auVar171,auVar187);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(local_1670 + 0x30 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar168);
            auVar64 = vcvtdq2ps_avx(auVar64);
            uVar52 = *(undefined4 *)(local_1670 + 0x4c + local_1688);
            auVar172._4_4_ = uVar52;
            auVar172._0_4_ = uVar52;
            auVar172._8_4_ = uVar52;
            auVar172._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x40 + local_1688);
            auVar188._4_4_ = uVar52;
            auVar188._0_4_ = uVar52;
            auVar188._8_4_ = uVar52;
            auVar188._12_4_ = uVar52;
            auVar77 = vfmadd213ps_fma(auVar64,auVar172,auVar188);
            auVar190._8_8_ = 0;
            auVar190._0_8_ = *(ulong *)(local_1670 + 0x60 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar190);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar192._8_8_ = 0;
            auVar192._0_8_ = *(ulong *)(local_1670 + 0x34 + local_1688);
            auVar63 = vpmovzxbd_avx(auVar192);
            auVar63 = vcvtdq2ps_avx(auVar63);
            auVar63 = vfmadd213ps_fma(auVar63,auVar172,auVar188);
            uVar52 = *(undefined4 *)(local_1670 + 0x7c + local_1688);
            auVar173._4_4_ = uVar52;
            auVar173._0_4_ = uVar52;
            auVar173._8_4_ = uVar52;
            auVar173._12_4_ = uVar52;
            uVar52 = *(undefined4 *)(local_1670 + 0x70 + local_1688);
            auVar189._4_4_ = uVar52;
            auVar189._0_4_ = uVar52;
            auVar189._8_4_ = uVar52;
            auVar189._12_4_ = uVar52;
            auVar90 = vfmadd213ps_fma(auVar64,auVar173,auVar189);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = *(ulong *)(local_1670 + 100 + local_1688);
            auVar64 = vpmovzxbd_avx(auVar91);
            auVar64 = vcvtdq2ps_avx(auVar64);
            auVar116 = vfmadd213ps_fma(auVar64,auVar173,auVar189);
            fVar154 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(local_1670 + 0x80 + local_1688))
                      * *(float *)(local_1670 + 0x84 + local_1688);
            auVar174._4_4_ = fVar154;
            auVar174._0_4_ = fVar154;
            auVar174._8_4_ = fVar154;
            auVar174._12_4_ = fVar154;
            auVar64 = vsubps_avx(auVar62,auVar10);
            auVar10 = vfmadd213ps_fma(auVar64,auVar174,auVar10);
            auVar64 = vsubps_avx(auVar88,auVar76);
            auVar62 = vfmadd213ps_fma(auVar64,auVar174,auVar76);
            auVar64 = vsubps_avx(auVar104,auVar89);
            auVar76 = vfmadd213ps_fma(auVar64,auVar174,auVar89);
            auVar64 = vsubps_avx(auVar115,auVar105);
            auVar88 = vfmadd213ps_fma(auVar64,auVar174,auVar105);
            auVar64 = vsubps_avx(auVar90,auVar77);
            auVar89 = vfmadd213ps_fma(auVar64,auVar174,auVar77);
            auVar64 = vsubps_avx(auVar116,auVar63);
            auVar104 = vfmadd213ps_fma(auVar64,auVar174,auVar63);
            auVar64 = vpminub_avx(auVar65,auVar78);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar55;
            auVar64 = vpcmpeqb_avx(auVar66,auVar64);
            auVar63 = vsubps_avx(auVar10,local_14c0);
            auVar79._0_4_ = auVar63._0_4_ * local_14e0;
            auVar79._4_4_ = auVar63._4_4_ * fStack_14dc;
            auVar79._8_4_ = auVar63._8_4_ * fStack_14d8;
            auVar79._12_4_ = auVar63._12_4_ * fStack_14d4;
            auVar63 = vsubps_avx(auVar76,local_14d0);
            auVar118._0_4_ = auVar63._0_4_ * local_14f0;
            auVar118._4_4_ = auVar63._4_4_ * fStack_14ec;
            auVar118._8_4_ = auVar63._8_4_ * fStack_14e8;
            auVar118._12_4_ = auVar63._12_4_ * fStack_14e4;
            auVar63 = vsubps_avx(auVar62,local_14c0);
            auVar106._0_4_ = auVar63._0_4_ * local_1480;
            auVar106._4_4_ = auVar63._4_4_ * fStack_147c;
            auVar106._8_4_ = auVar63._8_4_ * fStack_1478;
            auVar106._12_4_ = auVar63._12_4_ * fStack_1474;
            auVar63 = vsubps_avx(auVar88,local_14d0);
            auVar122._0_4_ = auVar63._0_4_ * local_1490;
            auVar122._4_4_ = auVar63._4_4_ * fStack_148c;
            auVar122._8_4_ = auVar63._8_4_ * fStack_1488;
            auVar122._12_4_ = auVar63._12_4_ * fStack_1484;
            auVar10 = vpminsd_avx(auVar79,auVar106);
            auVar63 = vpmaxsd_avx(auVar79,auVar106);
            auVar62 = vpminsd_avx(auVar118,auVar122);
            auVar10 = vpmaxsd_avx(auVar10,auVar62);
            auVar62 = vpmaxsd_avx(auVar118,auVar122);
            auVar76 = vsubps_avx(auVar89,local_1630);
            auVar123._0_4_ = auVar76._0_4_ * local_1470;
            auVar123._4_4_ = auVar76._4_4_ * fStack_146c;
            auVar123._8_4_ = auVar76._8_4_ * fStack_1468;
            auVar123._12_4_ = auVar76._12_4_ * fStack_1464;
            auVar76 = vsubps_avx(auVar104,local_1630);
            auVar92._0_4_ = auVar76._0_4_ * local_14a0;
            auVar92._4_4_ = auVar76._4_4_ * fStack_149c;
            auVar92._8_4_ = auVar76._8_4_ * fStack_1498;
            auVar92._12_4_ = auVar76._12_4_ * fStack_1494;
            auVar76 = vpminsd_avx(auVar63,auVar62);
            auVar62 = vpminsd_avx(auVar123,auVar92);
            auVar63 = vpmaxsd_avx(auVar123,auVar92);
            auVar18._4_4_ = iStack_14ac;
            auVar18._0_4_ = local_14b0;
            auVar18._8_4_ = iStack_14a8;
            auVar18._12_4_ = iStack_14a4;
            auVar62 = vpmaxsd_avx(auVar62,auVar18);
            local_13f0 = vpmaxsd_avx(auVar10,auVar62);
            auVar17._4_4_ = iStack_161c;
            auVar17._0_4_ = local_1620;
            auVar17._8_4_ = iStack_1618;
            auVar17._12_4_ = iStack_1614;
            auVar63 = vpminsd_avx(auVar63,auVar17);
            auVar63 = vpminsd_avx(auVar76,auVar63);
            auVar10 = vpmovsxbd_avx(auVar64);
            auVar64 = vpcmpgtd_avx(local_13f0,auVar63);
            auVar64 = vpandn_avx(auVar64,auVar10);
            uVar53 = vmovmskps_avx(auVar64);
            if (uVar53 != 0) {
              local_1688 = local_1688 + local_1670;
              local_1680 = (ulong)(uVar53 & 0xff);
              do {
                pRVar50 = local_15c0;
                sVar49 = local_15c8;
                lVar16 = 0;
                for (uVar55 = local_1680; (uVar55 & 1) == 0;
                    uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                  lVar16 = lVar16 + 1;
                }
                fVar154 = *(float *)(ray + k * 4 + 0x100);
                if (*(float *)(local_13f0 + lVar16 * 4) <= fVar154) {
                  local_1400 = ZEXT416((uint)fVar154);
                  uVar2 = *(ushort *)(local_1688 + lVar16 * 8);
                  uVar3 = *(ushort *)(local_1688 + 2 + lVar16 * 8);
                  local_1660._4_4_ = *(uint *)(local_1688 + 0x88);
                  local_1690 = (ulong)local_1660._4_4_;
                  local_1520._4_4_ = *(uint *)(local_1688 + 4 + lVar16 * 8);
                  local_1668 = (ulong)local_1520._4_4_;
                  local_15a8 = context->scene;
                  pGVar4 = (local_15a8->geometries).items[local_1690].ptr;
                  local_15b0 = *(long *)&pGVar4->field_0x58;
                  local_15b8 = pGVar4[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_1668;
                  fVar153 = (pGVar4->time_range).lower;
                  auVar69._4_4_ = fVar153;
                  auVar69._0_4_ = fVar153;
                  auVar69._8_4_ = fVar153;
                  auVar69._12_4_ = fVar153;
                  auVar69._16_4_ = fVar153;
                  auVar69._20_4_ = fVar153;
                  auVar69._24_4_ = fVar153;
                  auVar69._28_4_ = fVar153;
                  fVar155 = pGVar4->fnumTimeSegments;
                  auVar67 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar69);
                  fVar153 = (pGVar4->time_range).upper - fVar153;
                  auVar70._4_4_ = fVar153;
                  auVar70._0_4_ = fVar153;
                  auVar70._8_4_ = fVar153;
                  auVar70._12_4_ = fVar153;
                  auVar70._16_4_ = fVar153;
                  auVar70._20_4_ = fVar153;
                  auVar70._24_4_ = fVar153;
                  auVar70._28_4_ = fVar153;
                  auVar67 = vdivps_avx(auVar67,auVar70);
                  auVar15._4_4_ = fVar155 * auVar67._4_4_;
                  auVar15._0_4_ = fVar155 * auVar67._0_4_;
                  auVar15._8_4_ = fVar155 * auVar67._8_4_;
                  auVar15._12_4_ = fVar155 * auVar67._12_4_;
                  auVar15._16_4_ = fVar155 * auVar67._16_4_;
                  auVar15._20_4_ = fVar155 * auVar67._20_4_;
                  auVar15._24_4_ = fVar155 * auVar67._24_4_;
                  auVar15._28_4_ = auVar67._28_4_;
                  auVar67 = vroundps_avx(auVar15,1);
                  fVar155 = fVar155 + -1.0;
                  auVar82._4_4_ = fVar155;
                  auVar82._0_4_ = fVar155;
                  auVar82._8_4_ = fVar155;
                  auVar82._12_4_ = fVar155;
                  auVar82._16_4_ = fVar155;
                  auVar82._20_4_ = fVar155;
                  auVar82._24_4_ = fVar155;
                  auVar82._28_4_ = fVar155;
                  auVar67 = vminps_avx(auVar67,auVar82);
                  auVar67 = vmaxps_avx(auVar67,_DAT_02020f00);
                  local_10e0 = vsubps_avx(auVar15,auVar67);
                  local_1100 = vcvtps2dq_avx(auVar67);
                  local_1674 = uVar2 & 0x7fff;
                  local_1678 = uVar3 & 0x7fff;
                  uVar53 = *(uint *)(local_15b0 + 4 + local_15b8);
                  uVar59 = (ulong)uVar53;
                  uVar58 = (ulong)(uVar53 * local_1678 +
                                  *(int *)(local_15b0 + local_15b8) + local_1674);
                  lVar5 = *(long *)&pGVar4[2].numPrimitives;
                  lVar60 = (long)*(int *)(local_1100 + k * 4) * 0x38;
                  lVar6 = *(long *)(lVar5 + 0x10 + lVar60);
                  lVar7 = *(long *)(lVar5 + lVar60);
                  auVar64 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar58);
                  lVar8 = *(long *)(lVar5 + 0x48 + lVar60);
                  auVar63 = *(undefined1 (*) [16])(lVar7 + (uVar58 + 1) * lVar6);
                  lVar16 = uVar58 + uVar59;
                  auVar10 = *(undefined1 (*) [16])(lVar7 + lVar16 * lVar6);
                  lVar61 = uVar58 + uVar59 + 1;
                  auVar76 = *(undefined1 (*) [16])(lVar7 + lVar61 * lVar6);
                  lVar56 = uVar58 + (-1 < (short)uVar2) + 1;
                  auVar62 = *(undefined1 (*) [16])(lVar7 + lVar56 * lVar6);
                  lVar57 = (ulong)(-1 < (short)uVar2) + lVar61;
                  auVar88 = *(undefined1 (*) [16])(lVar7 + lVar57 * lVar6);
                  uVar55 = 0;
                  if (-1 < (short)uVar3) {
                    uVar55 = uVar59;
                  }
                  auVar89 = *(undefined1 (*) [16])(lVar7 + (lVar16 + uVar55) * lVar6);
                  auVar104 = *(undefined1 (*) [16])(lVar7 + (lVar61 + uVar55) * lVar6);
                  auVar105 = *(undefined1 (*) [16])(lVar7 + lVar6 * (uVar55 + lVar57));
                  lVar5 = *(long *)(lVar5 + 0x38 + lVar60);
                  uVar52 = *(undefined4 *)(local_10e0 + local_15c8 * 4);
                  auVar193._4_4_ = uVar52;
                  auVar193._0_4_ = uVar52;
                  auVar193._8_4_ = uVar52;
                  auVar193._12_4_ = uVar52;
                  auVar115 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * uVar58),auVar64);
                  auVar115 = vfmadd213ps_fma(auVar115,auVar193,auVar64);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (uVar58 + 1)),auVar63)
                  ;
                  auVar77 = vfmadd213ps_fma(auVar64,auVar193,auVar63);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar16),auVar10);
                  auVar90 = vfmadd213ps_fma(auVar64,auVar193,auVar10);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar61),auVar76);
                  auVar116 = vfmadd213ps_fma(auVar64,auVar193,auVar76);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar56),auVar62);
                  auVar63 = vfmadd213ps_fma(auVar64,auVar193,auVar62);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar57),auVar88);
                  auVar17 = vfmadd213ps_fma(auVar64,auVar193,auVar88);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar16 + uVar55)),
                                       auVar89);
                  auVar18 = vfmadd213ps_fma(auVar64,auVar193,auVar89);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar61 + uVar55)),
                                       auVar104);
                  auVar65 = vfmadd213ps_fma(auVar64,auVar193,auVar104);
                  auVar64 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + (uVar55 + lVar57) * lVar8),
                                       auVar105);
                  auVar105 = vfmadd213ps_fma(auVar64,auVar193,auVar105);
                  auVar10 = vunpcklps_avx(auVar77,auVar17);
                  auVar64 = vunpckhps_avx(auVar77,auVar17);
                  auVar62 = vunpcklps_avx(auVar63,auVar116);
                  auVar63 = vunpckhps_avx(auVar63,auVar116);
                  auVar76 = vunpcklps_avx(auVar64,auVar63);
                  auVar88 = vunpcklps_avx(auVar10,auVar62);
                  auVar64 = vunpckhps_avx(auVar10,auVar62);
                  auVar62 = vunpcklps_avx(auVar90,auVar65);
                  auVar63 = vunpckhps_avx(auVar90,auVar65);
                  auVar89 = vunpcklps_avx(auVar116,auVar18);
                  auVar10 = vunpckhps_avx(auVar116,auVar18);
                  auVar10 = vunpcklps_avx(auVar63,auVar10);
                  auVar104 = vunpcklps_avx(auVar62,auVar89);
                  auVar63 = vunpckhps_avx(auVar62,auVar89);
                  auVar124._16_16_ = auVar65;
                  auVar124._0_16_ = auVar90;
                  auVar83._16_16_ = auVar17;
                  auVar83._0_16_ = auVar77;
                  auVar67 = vunpcklps_avx(auVar83,auVar124);
                  auVar139._16_16_ = auVar116;
                  auVar139._0_16_ = auVar115;
                  auVar94._16_16_ = auVar105;
                  auVar94._0_16_ = auVar116;
                  auVar68 = vunpcklps_avx(auVar139,auVar94);
                  auVar15 = vunpcklps_avx(auVar68,auVar67);
                  auVar67 = vunpckhps_avx(auVar68,auVar67);
                  auVar68 = vunpckhps_avx(auVar83,auVar124);
                  auVar81 = vunpckhps_avx(auVar139,auVar94);
                  auVar68 = vunpcklps_avx(auVar81,auVar68);
                  auVar95._16_16_ = auVar88;
                  auVar95._0_16_ = auVar88;
                  auVar125._16_16_ = auVar64;
                  auVar125._0_16_ = auVar64;
                  auVar133._16_16_ = auVar76;
                  auVar133._0_16_ = auVar76;
                  auVar107._16_16_ = auVar104;
                  auVar107._0_16_ = auVar104;
                  auVar140._16_16_ = auVar63;
                  auVar140._0_16_ = auVar63;
                  local_1380 = &local_1699;
                  uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4);
                  auVar146._4_4_ = uVar52;
                  auVar146._0_4_ = uVar52;
                  auVar146._8_4_ = uVar52;
                  auVar146._12_4_ = uVar52;
                  auVar146._16_4_ = uVar52;
                  auVar146._20_4_ = uVar52;
                  auVar146._24_4_ = uVar52;
                  auVar146._28_4_ = uVar52;
                  uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x20);
                  auVar150._4_4_ = uVar52;
                  auVar150._0_4_ = uVar52;
                  auVar150._8_4_ = uVar52;
                  auVar150._12_4_ = uVar52;
                  auVar150._16_4_ = uVar52;
                  auVar150._20_4_ = uVar52;
                  auVar150._24_4_ = uVar52;
                  auVar150._28_4_ = uVar52;
                  auVar71._16_16_ = auVar10;
                  auVar71._0_16_ = auVar10;
                  uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x40);
                  auVar158._4_4_ = uVar52;
                  auVar158._0_4_ = uVar52;
                  auVar158._8_4_ = uVar52;
                  auVar158._12_4_ = uVar52;
                  auVar158._16_4_ = uVar52;
                  auVar158._20_4_ = uVar52;
                  auVar158._24_4_ = uVar52;
                  auVar158._28_4_ = uVar52;
                  auVar15 = vsubps_avx(auVar15,auVar146);
                  local_1460 = vsubps_avx(auVar67,auVar150);
                  local_1540 = vsubps_avx(auVar68,auVar158);
                  auVar67 = vsubps_avx(auVar95,auVar146);
                  auVar68 = vsubps_avx(auVar125,auVar150);
                  auVar81 = vsubps_avx(auVar133,auVar158);
                  auVar69 = vsubps_avx(auVar107,auVar146);
                  auVar70 = vsubps_avx(auVar140,auVar150);
                  auVar82 = vsubps_avx(auVar71,auVar158);
                  local_1120 = vsubps_avx(auVar69,auVar15);
                  local_1160 = vsubps_avx(auVar70,local_1460);
                  local_1140 = vsubps_avx(auVar82,local_1540);
                  auVar72._0_4_ = auVar15._0_4_ + auVar69._0_4_;
                  auVar72._4_4_ = auVar15._4_4_ + auVar69._4_4_;
                  auVar72._8_4_ = auVar15._8_4_ + auVar69._8_4_;
                  auVar72._12_4_ = auVar15._12_4_ + auVar69._12_4_;
                  auVar72._16_4_ = auVar15._16_4_ + auVar69._16_4_;
                  auVar72._20_4_ = auVar15._20_4_ + auVar69._20_4_;
                  auVar72._24_4_ = auVar15._24_4_ + auVar69._24_4_;
                  auVar72._28_4_ = auVar15._28_4_ + auVar69._28_4_;
                  auVar108._0_4_ = auVar70._0_4_ + local_1460._0_4_;
                  auVar108._4_4_ = auVar70._4_4_ + local_1460._4_4_;
                  auVar108._8_4_ = auVar70._8_4_ + local_1460._8_4_;
                  auVar108._12_4_ = auVar70._12_4_ + local_1460._12_4_;
                  auVar108._16_4_ = auVar70._16_4_ + local_1460._16_4_;
                  auVar108._20_4_ = auVar70._20_4_ + local_1460._20_4_;
                  auVar108._24_4_ = auVar70._24_4_ + local_1460._24_4_;
                  auVar108._28_4_ = auVar70._28_4_ + local_1460._28_4_;
                  fVar169 = local_1540._0_4_;
                  auVar134._0_4_ = fVar169 + auVar82._0_4_;
                  fVar175 = local_1540._4_4_;
                  auVar134._4_4_ = fVar175 + auVar82._4_4_;
                  fVar177 = local_1540._8_4_;
                  auVar134._8_4_ = fVar177 + auVar82._8_4_;
                  fVar179 = local_1540._12_4_;
                  auVar134._12_4_ = fVar179 + auVar82._12_4_;
                  fVar181 = local_1540._16_4_;
                  auVar134._16_4_ = fVar181 + auVar82._16_4_;
                  fVar183 = local_1540._20_4_;
                  auVar134._20_4_ = fVar183 + auVar82._20_4_;
                  fVar185 = local_1540._24_4_;
                  auVar134._24_4_ = fVar185 + auVar82._24_4_;
                  auVar134._28_4_ = local_1540._28_4_ + auVar82._28_4_;
                  auVar13._4_4_ = local_1140._4_4_ * auVar108._4_4_;
                  auVar13._0_4_ = local_1140._0_4_ * auVar108._0_4_;
                  auVar13._8_4_ = local_1140._8_4_ * auVar108._8_4_;
                  auVar13._12_4_ = local_1140._12_4_ * auVar108._12_4_;
                  auVar13._16_4_ = local_1140._16_4_ * auVar108._16_4_;
                  auVar13._20_4_ = local_1140._20_4_ * auVar108._20_4_;
                  auVar13._24_4_ = local_1140._24_4_ * auVar108._24_4_;
                  auVar13._28_4_ = auVar63._12_4_;
                  auVar63 = vfmsub231ps_fma(auVar13,local_1160,auVar134);
                  auVar14._4_4_ = local_1120._4_4_ * auVar134._4_4_;
                  auVar14._0_4_ = local_1120._0_4_ * auVar134._0_4_;
                  auVar14._8_4_ = local_1120._8_4_ * auVar134._8_4_;
                  auVar14._12_4_ = local_1120._12_4_ * auVar134._12_4_;
                  auVar14._16_4_ = local_1120._16_4_ * auVar134._16_4_;
                  auVar14._20_4_ = local_1120._20_4_ * auVar134._20_4_;
                  auVar14._24_4_ = local_1120._24_4_ * auVar134._24_4_;
                  auVar14._28_4_ = auVar134._28_4_;
                  auVar64 = vfmsub231ps_fma(auVar14,local_1140,auVar72);
                  auVar19._4_4_ = local_1160._4_4_ * auVar72._4_4_;
                  auVar19._0_4_ = local_1160._0_4_ * auVar72._0_4_;
                  auVar19._8_4_ = local_1160._8_4_ * auVar72._8_4_;
                  auVar19._12_4_ = local_1160._12_4_ * auVar72._12_4_;
                  auVar19._16_4_ = local_1160._16_4_ * auVar72._16_4_;
                  auVar19._20_4_ = local_1160._20_4_ * auVar72._20_4_;
                  auVar19._24_4_ = local_1160._24_4_ * auVar72._24_4_;
                  auVar19._28_4_ = auVar72._28_4_;
                  auVar10 = vfmsub231ps_fma(auVar19,local_1120,auVar108);
                  uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0xa0);
                  auVar191._4_4_ = uVar52;
                  auVar191._0_4_ = uVar52;
                  auVar191._8_4_ = uVar52;
                  auVar191._12_4_ = uVar52;
                  auVar191._16_4_ = uVar52;
                  auVar191._20_4_ = uVar52;
                  auVar191._24_4_ = uVar52;
                  auVar191._28_4_ = uVar52;
                  fVar153 = *(float *)(local_15c0 + local_15c8 * 4 + 0xc0);
                  local_1180._4_4_ = fVar153;
                  local_1180._0_4_ = fVar153;
                  local_1180._8_4_ = fVar153;
                  local_1180._12_4_ = fVar153;
                  local_1180._16_4_ = fVar153;
                  local_1180._20_4_ = fVar153;
                  local_1180._24_4_ = fVar153;
                  local_1180._28_4_ = fVar153;
                  auVar20._4_4_ = auVar10._4_4_ * fVar153;
                  auVar20._0_4_ = auVar10._0_4_ * fVar153;
                  auVar20._8_4_ = auVar10._8_4_ * fVar153;
                  auVar20._12_4_ = auVar10._12_4_ * fVar153;
                  auVar20._16_4_ = fVar153 * 0.0;
                  auVar20._20_4_ = fVar153 * 0.0;
                  auVar20._24_4_ = fVar153 * 0.0;
                  auVar20._28_4_ = auVar108._28_4_;
                  auVar64 = vfmadd231ps_fma(auVar20,auVar191,ZEXT1632(auVar64));
                  uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x80);
                  auVar73._4_4_ = uVar52;
                  auVar73._0_4_ = uVar52;
                  auVar73._8_4_ = uVar52;
                  auVar73._12_4_ = uVar52;
                  auVar73._16_4_ = uVar52;
                  auVar73._20_4_ = uVar52;
                  auVar73._24_4_ = uVar52;
                  auVar73._28_4_ = uVar52;
                  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar73,ZEXT1632(auVar63));
                  local_11a0 = vsubps_avx(local_1460,auVar68);
                  local_11c0 = vsubps_avx(local_1540,auVar81);
                  auVar135._0_4_ = local_1460._0_4_ + auVar68._0_4_;
                  auVar135._4_4_ = local_1460._4_4_ + auVar68._4_4_;
                  auVar135._8_4_ = local_1460._8_4_ + auVar68._8_4_;
                  auVar135._12_4_ = local_1460._12_4_ + auVar68._12_4_;
                  auVar135._16_4_ = local_1460._16_4_ + auVar68._16_4_;
                  auVar135._20_4_ = local_1460._20_4_ + auVar68._20_4_;
                  auVar135._24_4_ = local_1460._24_4_ + auVar68._24_4_;
                  fVar155 = auVar68._28_4_;
                  auVar135._28_4_ = local_1460._28_4_ + fVar155;
                  auVar141._0_4_ = fVar169 + auVar81._0_4_;
                  auVar141._4_4_ = fVar175 + auVar81._4_4_;
                  auVar141._8_4_ = fVar177 + auVar81._8_4_;
                  auVar141._12_4_ = fVar179 + auVar81._12_4_;
                  auVar141._16_4_ = fVar181 + auVar81._16_4_;
                  auVar141._20_4_ = fVar183 + auVar81._20_4_;
                  auVar141._24_4_ = fVar185 + auVar81._24_4_;
                  fVar161 = auVar81._28_4_;
                  auVar141._28_4_ = local_1540._28_4_ + fVar161;
                  fVar98 = local_11c0._0_4_;
                  fVar100 = local_11c0._4_4_;
                  auVar21._4_4_ = auVar135._4_4_ * fVar100;
                  auVar21._0_4_ = auVar135._0_4_ * fVar98;
                  fVar102 = local_11c0._8_4_;
                  auVar21._8_4_ = auVar135._8_4_ * fVar102;
                  fVar109 = local_11c0._12_4_;
                  auVar21._12_4_ = auVar135._12_4_ * fVar109;
                  fVar111 = local_11c0._16_4_;
                  auVar21._16_4_ = auVar135._16_4_ * fVar111;
                  fVar113 = local_11c0._20_4_;
                  auVar21._20_4_ = auVar135._20_4_ * fVar113;
                  fVar11 = local_11c0._24_4_;
                  auVar21._24_4_ = auVar135._24_4_ * fVar11;
                  auVar21._28_4_ = fVar161;
                  auVar10 = vfmsub231ps_fma(auVar21,local_11a0,auVar141);
                  auVar13 = vsubps_avx(auVar15,auVar67);
                  fVar170 = auVar13._0_4_;
                  fVar176 = auVar13._4_4_;
                  auVar22._4_4_ = fVar176 * auVar141._4_4_;
                  auVar22._0_4_ = fVar170 * auVar141._0_4_;
                  fVar178 = auVar13._8_4_;
                  auVar22._8_4_ = fVar178 * auVar141._8_4_;
                  fVar180 = auVar13._12_4_;
                  auVar22._12_4_ = fVar180 * auVar141._12_4_;
                  fVar182 = auVar13._16_4_;
                  auVar22._16_4_ = fVar182 * auVar141._16_4_;
                  fVar184 = auVar13._20_4_;
                  auVar22._20_4_ = fVar184 * auVar141._20_4_;
                  fVar186 = auVar13._24_4_;
                  auVar22._24_4_ = fVar186 * auVar141._24_4_;
                  auVar22._28_4_ = local_1140._28_4_;
                  auVar142._0_4_ = auVar15._0_4_ + auVar67._0_4_;
                  auVar142._4_4_ = auVar15._4_4_ + auVar67._4_4_;
                  auVar142._8_4_ = auVar15._8_4_ + auVar67._8_4_;
                  auVar142._12_4_ = auVar15._12_4_ + auVar67._12_4_;
                  auVar142._16_4_ = auVar15._16_4_ + auVar67._16_4_;
                  auVar142._20_4_ = auVar15._20_4_ + auVar67._20_4_;
                  auVar142._24_4_ = auVar15._24_4_ + auVar67._24_4_;
                  auVar142._28_4_ = auVar15._28_4_ + auVar67._28_4_;
                  auVar63 = vfmsub231ps_fma(auVar22,local_11c0,auVar142);
                  fVar99 = local_11a0._0_4_;
                  fVar101 = local_11a0._4_4_;
                  auVar23._4_4_ = auVar142._4_4_ * fVar101;
                  auVar23._0_4_ = auVar142._0_4_ * fVar99;
                  fVar103 = local_11a0._8_4_;
                  auVar23._8_4_ = auVar142._8_4_ * fVar103;
                  fVar110 = local_11a0._12_4_;
                  auVar23._12_4_ = auVar142._12_4_ * fVar110;
                  fVar112 = local_11a0._16_4_;
                  auVar23._16_4_ = auVar142._16_4_ * fVar112;
                  fVar114 = local_11a0._20_4_;
                  auVar23._20_4_ = auVar142._20_4_ * fVar114;
                  fVar12 = local_11a0._24_4_;
                  auVar23._24_4_ = auVar142._24_4_ * fVar12;
                  auVar23._28_4_ = auVar142._28_4_;
                  auVar62 = vfmsub231ps_fma(auVar23,auVar13,auVar135);
                  auVar24._4_4_ = auVar62._4_4_ * fVar153;
                  auVar24._0_4_ = auVar62._0_4_ * fVar153;
                  auVar24._8_4_ = auVar62._8_4_ * fVar153;
                  auVar24._12_4_ = auVar62._12_4_ * fVar153;
                  auVar24._16_4_ = fVar153 * 0.0;
                  auVar24._20_4_ = fVar153 * 0.0;
                  auVar24._24_4_ = fVar153 * 0.0;
                  auVar24._28_4_ = auVar13._28_4_;
                  auVar63 = vfmadd231ps_fma(auVar24,auVar191,ZEXT1632(auVar63));
                  auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar73,ZEXT1632(auVar10));
                  auVar14 = vsubps_avx(auVar67,auVar69);
                  auVar126._0_4_ = auVar67._0_4_ + auVar69._0_4_;
                  auVar126._4_4_ = auVar67._4_4_ + auVar69._4_4_;
                  auVar126._8_4_ = auVar67._8_4_ + auVar69._8_4_;
                  auVar126._12_4_ = auVar67._12_4_ + auVar69._12_4_;
                  auVar126._16_4_ = auVar67._16_4_ + auVar69._16_4_;
                  auVar126._20_4_ = auVar67._20_4_ + auVar69._20_4_;
                  auVar126._24_4_ = auVar67._24_4_ + auVar69._24_4_;
                  auVar126._28_4_ = auVar67._28_4_ + auVar69._28_4_;
                  auVar69 = vsubps_avx(auVar68,auVar70);
                  auVar147._0_4_ = auVar70._0_4_ + auVar68._0_4_;
                  auVar147._4_4_ = auVar70._4_4_ + auVar68._4_4_;
                  auVar147._8_4_ = auVar70._8_4_ + auVar68._8_4_;
                  auVar147._12_4_ = auVar70._12_4_ + auVar68._12_4_;
                  auVar147._16_4_ = auVar70._16_4_ + auVar68._16_4_;
                  auVar147._20_4_ = auVar70._20_4_ + auVar68._20_4_;
                  auVar147._24_4_ = auVar70._24_4_ + auVar68._24_4_;
                  auVar147._28_4_ = auVar70._28_4_ + fVar155;
                  auVar70 = vsubps_avx(auVar81,auVar82);
                  auVar84._0_4_ = auVar81._0_4_ + auVar82._0_4_;
                  auVar84._4_4_ = auVar81._4_4_ + auVar82._4_4_;
                  auVar84._8_4_ = auVar81._8_4_ + auVar82._8_4_;
                  auVar84._12_4_ = auVar81._12_4_ + auVar82._12_4_;
                  auVar84._16_4_ = auVar81._16_4_ + auVar82._16_4_;
                  auVar84._20_4_ = auVar81._20_4_ + auVar82._20_4_;
                  auVar84._24_4_ = auVar81._24_4_ + auVar82._24_4_;
                  auVar84._28_4_ = fVar161 + auVar82._28_4_;
                  auVar25._4_4_ = auVar147._4_4_ * auVar70._4_4_;
                  auVar25._0_4_ = auVar147._0_4_ * auVar70._0_4_;
                  auVar25._8_4_ = auVar147._8_4_ * auVar70._8_4_;
                  auVar25._12_4_ = auVar147._12_4_ * auVar70._12_4_;
                  auVar25._16_4_ = auVar147._16_4_ * auVar70._16_4_;
                  auVar25._20_4_ = auVar147._20_4_ * auVar70._20_4_;
                  auVar25._24_4_ = auVar147._24_4_ * auVar70._24_4_;
                  auVar25._28_4_ = fVar155;
                  auVar62 = vfmsub231ps_fma(auVar25,auVar69,auVar84);
                  auVar26._4_4_ = auVar84._4_4_ * auVar14._4_4_;
                  auVar26._0_4_ = auVar84._0_4_ * auVar14._0_4_;
                  auVar26._8_4_ = auVar84._8_4_ * auVar14._8_4_;
                  auVar26._12_4_ = auVar84._12_4_ * auVar14._12_4_;
                  auVar26._16_4_ = auVar84._16_4_ * auVar14._16_4_;
                  auVar26._20_4_ = auVar84._20_4_ * auVar14._20_4_;
                  auVar26._24_4_ = auVar84._24_4_ * auVar14._24_4_;
                  auVar26._28_4_ = auVar84._28_4_;
                  auVar10 = vfmsub231ps_fma(auVar26,auVar70,auVar126);
                  auVar27._4_4_ = auVar126._4_4_ * auVar69._4_4_;
                  auVar27._0_4_ = auVar126._0_4_ * auVar69._0_4_;
                  auVar27._8_4_ = auVar126._8_4_ * auVar69._8_4_;
                  auVar27._12_4_ = auVar126._12_4_ * auVar69._12_4_;
                  auVar27._16_4_ = auVar126._16_4_ * auVar69._16_4_;
                  auVar27._20_4_ = auVar126._20_4_ * auVar69._20_4_;
                  auVar27._24_4_ = auVar126._24_4_ * auVar69._24_4_;
                  auVar27._28_4_ = auVar126._28_4_;
                  auVar76 = vfmsub231ps_fma(auVar27,auVar14,auVar147);
                  auVar127._0_4_ = auVar76._0_4_ * fVar153;
                  auVar127._4_4_ = auVar76._4_4_ * fVar153;
                  auVar127._8_4_ = auVar76._8_4_ * fVar153;
                  auVar127._12_4_ = auVar76._12_4_ * fVar153;
                  auVar127._16_4_ = fVar153 * 0.0;
                  auVar127._20_4_ = fVar153 * 0.0;
                  auVar127._24_4_ = fVar153 * 0.0;
                  auVar127._28_4_ = 0;
                  auVar10 = vfmadd231ps_fma(auVar127,auVar191,ZEXT1632(auVar10));
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar73,ZEXT1632(auVar62));
                  auVar80._0_4_ = auVar10._0_4_ + auVar63._0_4_ + auVar64._0_4_;
                  auVar80._4_4_ = auVar10._4_4_ + auVar63._4_4_ + auVar64._4_4_;
                  auVar80._8_4_ = auVar10._8_4_ + auVar63._8_4_ + auVar64._8_4_;
                  auVar80._12_4_ = auVar10._12_4_ + auVar63._12_4_ + auVar64._12_4_;
                  local_13a0 = ZEXT1632(auVar80);
                  auVar119._8_4_ = 0x7fffffff;
                  auVar119._0_8_ = 0x7fffffff7fffffff;
                  auVar119._12_4_ = 0x7fffffff;
                  auVar119._16_4_ = 0x7fffffff;
                  auVar119._20_4_ = 0x7fffffff;
                  auVar119._24_4_ = 0x7fffffff;
                  auVar119._28_4_ = 0x7fffffff;
                  local_1200 = ZEXT1632(auVar63);
                  auVar67 = vminps_avx(ZEXT1632(auVar64),local_1200);
                  auVar67 = vminps_avx(auVar67,ZEXT1632(auVar10));
                  local_1220 = vandps_avx(local_13a0,auVar119);
                  fVar155 = local_1220._0_4_ * 1.1920929e-07;
                  fVar161 = local_1220._4_4_ * 1.1920929e-07;
                  auVar28._4_4_ = fVar161;
                  auVar28._0_4_ = fVar155;
                  fVar162 = local_1220._8_4_ * 1.1920929e-07;
                  auVar28._8_4_ = fVar162;
                  fVar163 = local_1220._12_4_ * 1.1920929e-07;
                  auVar28._12_4_ = fVar163;
                  fVar164 = local_1220._16_4_ * 1.1920929e-07;
                  auVar28._16_4_ = fVar164;
                  fVar165 = local_1220._20_4_ * 1.1920929e-07;
                  auVar28._20_4_ = fVar165;
                  fVar166 = local_1220._24_4_ * 1.1920929e-07;
                  auVar28._24_4_ = fVar166;
                  auVar28._28_4_ = 0x34000000;
                  auVar151._0_8_ = CONCAT44(fVar161,fVar155) ^ 0x8000000080000000;
                  auVar151._8_4_ = -fVar162;
                  auVar151._12_4_ = -fVar163;
                  auVar151._16_4_ = -fVar164;
                  auVar151._20_4_ = -fVar165;
                  auVar151._24_4_ = -fVar166;
                  auVar151._28_4_ = 0xb4000000;
                  auVar67 = vcmpps_avx(auVar67,auVar151,5);
                  local_11e0 = ZEXT1632(auVar64);
                  auVar81 = vmaxps_avx(local_11e0,local_1200);
                  auVar68 = vmaxps_avx(auVar81,ZEXT1632(auVar10));
                  auVar68 = vcmpps_avx(auVar68,auVar28,2);
                  auVar68 = vorps_avx(auVar67,auVar68);
                  ray = pRVar50;
                  k = sVar49;
                  if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar68 >> 0x7f,0) != '\0') ||
                        (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar68 >> 0xbf,0) != '\0') ||
                      (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar68[0x1f] < '\0') {
                    auVar29._4_4_ = fVar101 * local_1140._4_4_;
                    auVar29._0_4_ = fVar99 * local_1140._0_4_;
                    auVar29._8_4_ = fVar103 * local_1140._8_4_;
                    auVar29._12_4_ = fVar110 * local_1140._12_4_;
                    auVar29._16_4_ = fVar112 * local_1140._16_4_;
                    auVar29._20_4_ = fVar114 * local_1140._20_4_;
                    auVar29._24_4_ = fVar12 * local_1140._24_4_;
                    auVar29._28_4_ = auVar67._28_4_;
                    auVar30._4_4_ = local_1160._4_4_ * fVar176;
                    auVar30._0_4_ = local_1160._0_4_ * fVar170;
                    auVar30._8_4_ = local_1160._8_4_ * fVar178;
                    auVar30._12_4_ = local_1160._12_4_ * fVar180;
                    auVar30._16_4_ = local_1160._16_4_ * fVar182;
                    auVar30._20_4_ = local_1160._20_4_ * fVar184;
                    auVar30._24_4_ = local_1160._24_4_ * fVar186;
                    auVar30._28_4_ = auVar81._28_4_;
                    auVar64 = vfmsub213ps_fma(local_1160,local_11c0,auVar29);
                    auVar31._4_4_ = auVar69._4_4_ * fVar100;
                    auVar31._0_4_ = auVar69._0_4_ * fVar98;
                    auVar31._8_4_ = auVar69._8_4_ * fVar102;
                    auVar31._12_4_ = auVar69._12_4_ * fVar109;
                    auVar31._16_4_ = auVar69._16_4_ * fVar111;
                    auVar31._20_4_ = auVar69._20_4_ * fVar113;
                    auVar31._24_4_ = auVar69._24_4_ * fVar11;
                    auVar31._28_4_ = 0x34000000;
                    auVar32._4_4_ = fVar176 * auVar70._4_4_;
                    auVar32._0_4_ = fVar170 * auVar70._0_4_;
                    auVar32._8_4_ = fVar178 * auVar70._8_4_;
                    auVar32._12_4_ = fVar180 * auVar70._12_4_;
                    auVar32._16_4_ = fVar182 * auVar70._16_4_;
                    auVar32._20_4_ = fVar184 * auVar70._20_4_;
                    auVar32._24_4_ = fVar186 * auVar70._24_4_;
                    auVar32._28_4_ = local_1220._28_4_;
                    auVar63 = vfmsub213ps_fma(auVar70,local_11a0,auVar31);
                    auVar67 = vandps_avx(auVar29,auVar119);
                    auVar81 = vandps_avx(auVar31,auVar119);
                    auVar67 = vcmpps_avx(auVar67,auVar81,1);
                    auVar70 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar64),auVar67);
                    auVar33._4_4_ = auVar14._4_4_ * fVar101;
                    auVar33._0_4_ = auVar14._0_4_ * fVar99;
                    auVar33._8_4_ = auVar14._8_4_ * fVar103;
                    auVar33._12_4_ = auVar14._12_4_ * fVar110;
                    auVar33._16_4_ = auVar14._16_4_ * fVar112;
                    auVar33._20_4_ = auVar14._20_4_ * fVar114;
                    auVar33._24_4_ = auVar14._24_4_ * fVar12;
                    auVar33._28_4_ = auVar81._28_4_;
                    auVar64 = vfmsub213ps_fma(auVar14,local_11c0,auVar32);
                    auVar34._4_4_ = local_1120._4_4_ * fVar100;
                    auVar34._0_4_ = local_1120._0_4_ * fVar98;
                    auVar34._8_4_ = local_1120._8_4_ * fVar102;
                    auVar34._12_4_ = local_1120._12_4_ * fVar109;
                    auVar34._16_4_ = local_1120._16_4_ * fVar111;
                    auVar34._20_4_ = local_1120._20_4_ * fVar113;
                    auVar34._24_4_ = local_1120._24_4_ * fVar11;
                    auVar34._28_4_ = local_11c0._28_4_;
                    auVar63 = vfmsub213ps_fma(local_1140,auVar13,auVar34);
                    auVar67 = vandps_avx(auVar34,auVar119);
                    auVar81 = vandps_avx(auVar32,auVar119);
                    auVar67 = vcmpps_avx(auVar67,auVar81,1);
                    auVar82 = vblendvps_avx(ZEXT1632(auVar64),ZEXT1632(auVar63),auVar67);
                    auVar64 = vfmsub213ps_fma(local_1120,local_11a0,auVar30);
                    auVar63 = vfmsub213ps_fma(auVar69,auVar13,auVar33);
                    auVar67 = vandps_avx(auVar30,auVar119);
                    auVar81 = vandps_avx(auVar33,auVar119);
                    auVar67 = vcmpps_avx(auVar67,auVar81,1);
                    auVar67 = vblendvps_avx(ZEXT1632(auVar63),ZEXT1632(auVar64),auVar67);
                    auVar64 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
                    fVar155 = auVar67._0_4_;
                    auVar120._0_4_ = fVar155 * fVar153;
                    fVar161 = auVar67._4_4_;
                    auVar120._4_4_ = fVar161 * fVar153;
                    fVar98 = auVar67._8_4_;
                    auVar120._8_4_ = fVar98 * fVar153;
                    fVar99 = auVar67._12_4_;
                    auVar120._12_4_ = fVar99 * fVar153;
                    fVar100 = auVar67._16_4_;
                    auVar120._16_4_ = fVar100 * fVar153;
                    fVar101 = auVar67._20_4_;
                    auVar120._20_4_ = fVar101 * fVar153;
                    fVar102 = auVar67._24_4_;
                    auVar120._24_4_ = fVar102 * fVar153;
                    auVar120._28_4_ = 0;
                    auVar63 = vfmadd213ps_fma(auVar191,auVar82,auVar120);
                    auVar63 = vfmadd213ps_fma(auVar73,auVar70,ZEXT1632(auVar63));
                    auVar81 = ZEXT1632(CONCAT412(auVar63._12_4_ + auVar63._12_4_,
                                                 CONCAT48(auVar63._8_4_ + auVar63._8_4_,
                                                          CONCAT44(auVar63._4_4_ + auVar63._4_4_,
                                                                   auVar63._0_4_ + auVar63._0_4_))))
                    ;
                    auVar35._4_4_ = fVar161 * fVar175;
                    auVar35._0_4_ = fVar155 * fVar169;
                    auVar35._8_4_ = fVar98 * fVar177;
                    auVar35._12_4_ = fVar99 * fVar179;
                    auVar35._16_4_ = fVar100 * fVar181;
                    auVar35._20_4_ = fVar101 * fVar183;
                    auVar35._24_4_ = fVar102 * fVar185;
                    auVar35._28_4_ = auVar68._28_4_;
                    auVar63 = vfmadd213ps_fma(local_1460,auVar82,auVar35);
                    auVar10 = vfmadd213ps_fma(auVar15,auVar70,ZEXT1632(auVar63));
                    auVar67 = vrcpps_avx(auVar81);
                    auVar159._8_4_ = 0x3f800000;
                    auVar159._0_8_ = &DAT_3f8000003f800000;
                    auVar159._12_4_ = 0x3f800000;
                    auVar159._16_4_ = 0x3f800000;
                    auVar159._20_4_ = 0x3f800000;
                    auVar159._24_4_ = 0x3f800000;
                    auVar159._28_4_ = 0x3f800000;
                    auVar63 = vfnmadd213ps_fma(auVar67,auVar81,auVar159);
                    auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar67,auVar67);
                    local_15a0 = ZEXT1632(CONCAT412(auVar63._12_4_ *
                                                    (auVar10._12_4_ + auVar10._12_4_),
                                                    CONCAT48(auVar63._8_4_ *
                                                             (auVar10._8_4_ + auVar10._8_4_),
                                                             CONCAT44(auVar63._4_4_ *
                                                                      (auVar10._4_4_ + auVar10._4_4_
                                                                      ),auVar63._0_4_ *
                                                                        (auVar10._0_4_ +
                                                                        auVar10._0_4_)))));
                    uVar52 = *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x60);
                    auVar152._4_4_ = uVar52;
                    auVar152._0_4_ = uVar52;
                    auVar152._8_4_ = uVar52;
                    auVar152._12_4_ = uVar52;
                    auVar152._16_4_ = uVar52;
                    auVar152._20_4_ = uVar52;
                    auVar152._24_4_ = uVar52;
                    auVar152._28_4_ = uVar52;
                    auVar67 = vcmpps_avx(auVar152,local_15a0,2);
                    auVar160._4_4_ = fVar154;
                    auVar160._0_4_ = fVar154;
                    auVar160._8_4_ = fVar154;
                    auVar160._12_4_ = fVar154;
                    auVar160._16_4_ = fVar154;
                    auVar160._20_4_ = fVar154;
                    auVar160._24_4_ = fVar154;
                    auVar160._28_4_ = fVar154;
                    auVar68 = vcmpps_avx(local_15a0,auVar160,2);
                    auVar67 = vandps_avx(auVar68,auVar67);
                    auVar63 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
                    auVar64 = vpand_avx(auVar63,auVar64);
                    auVar67 = vpmovsxwd_avx2(auVar64);
                    if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar67 >> 0x7f,0) != '\0') ||
                          (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar67 >> 0xbf,0) != '\0') ||
                        (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar67[0x1f] < '\0') {
                      auVar67 = vcmpps_avx(auVar81,_DAT_02020f00,4);
                      auVar63 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
                      auVar64 = vpand_avx(auVar64,auVar63);
                      local_1360 = vpmovsxwd_avx2(auVar64);
                      if ((((((((local_1360 >> 0x1f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0 ||
                               (local_1360 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (local_1360 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(local_1360 >> 0x7f,0) != '\0')
                            || (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                            ) || SUB321(local_1360 >> 0xbf,0) != '\0') ||
                          (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          local_1360[0x1f] < '\0') {
                        local_1380 = &local_1699;
                        auVar67 = vsubps_avx(local_13a0,local_1200);
                        auVar67 = vblendvps_avx(local_11e0,auVar67,local_1240);
                        auVar68 = vsubps_avx(local_13a0,local_11e0);
                        auVar68 = vblendvps_avx(local_1200,auVar68,local_1240);
                        local_1300 = local_15a0;
                        local_12e0._4_4_ = auVar70._4_4_ * (float)local_1260._4_4_;
                        local_12e0._0_4_ = auVar70._0_4_ * (float)local_1260._0_4_;
                        local_12e0._8_4_ = auVar70._8_4_ * fStack_1258;
                        local_12e0._12_4_ = auVar70._12_4_ * fStack_1254;
                        local_12e0._16_4_ = auVar70._16_4_ * fStack_1250;
                        local_12e0._20_4_ = auVar70._20_4_ * fStack_124c;
                        local_12e0._24_4_ = auVar70._24_4_ * fStack_1248;
                        local_12e0._28_4_ = 0;
                        local_12c0[0] = (float)local_1260._0_4_ * auVar82._0_4_;
                        local_12c0[1] = (float)local_1260._4_4_ * auVar82._4_4_;
                        local_12c0[2] = fStack_1258 * auVar82._8_4_;
                        local_12c0[3] = fStack_1254 * auVar82._12_4_;
                        fStack_12b0 = fStack_1250 * auVar82._16_4_;
                        fStack_12ac = fStack_124c * auVar82._20_4_;
                        fStack_12a8 = fStack_1248 * auVar82._24_4_;
                        uStack_12a4 = auVar82._28_4_;
                        local_12a0[0] = (float)local_1260._0_4_ * fVar155;
                        local_12a0[1] = (float)local_1260._4_4_ * fVar161;
                        local_12a0[2] = fStack_1258 * fVar98;
                        local_12a0[3] = fStack_1254 * fVar99;
                        fStack_1290 = fStack_1250 * fVar100;
                        fStack_128c = fStack_124c * fVar101;
                        fStack_1288 = fStack_1248 * fVar102;
                        uStack_1284 = auVar82._28_4_;
                        auVar74._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                        auVar74._8_4_ = local_1674;
                        auVar74._12_4_ = local_1674;
                        auVar74._16_4_ = local_1674;
                        auVar74._20_4_ = local_1674;
                        auVar74._24_4_ = local_1674;
                        auVar74._28_4_ = local_1674;
                        auVar81 = vpaddd_avx2(auVar74,_DAT_0205d4c0);
                        auVar96._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                        auVar96._8_4_ = local_1678;
                        auVar96._12_4_ = local_1678;
                        auVar96._16_4_ = local_1678;
                        auVar96._20_4_ = local_1678;
                        auVar96._24_4_ = local_1678;
                        auVar96._28_4_ = local_1678;
                        auVar15 = vpaddd_avx2(auVar96,_DAT_0205d4e0);
                        auVar93._0_4_ = (float)(int)(*(ushort *)(local_15b0 + 8 + local_15b8) - 1);
                        auVar93._4_12_ = auVar80._4_12_;
                        auVar64 = vrcpss_avx(auVar93,auVar93);
                        auVar63 = vfnmadd213ss_fma(auVar93,auVar64,SUB6416(ZEXT464(0x40000000),0));
                        fVar154 = auVar64._0_4_ * auVar63._0_4_;
                        auVar132._0_4_ = (float)(int)(*(ushort *)(local_15b0 + 10 + local_15b8) - 1)
                        ;
                        auVar132._4_12_ = auVar80._4_12_;
                        auVar64 = vrcpss_avx(auVar132,auVar132);
                        auVar63 = vfnmadd213ss_fma(auVar132,auVar64,SUB6416(ZEXT464(0x40000000),0));
                        fVar153 = auVar64._0_4_ * auVar63._0_4_;
                        auVar81 = vcvtdq2ps_avx(auVar81);
                        fVar155 = (auVar80._0_4_ * auVar81._0_4_ + auVar67._0_4_) * fVar154;
                        fVar161 = (auVar80._4_4_ * auVar81._4_4_ + auVar67._4_4_) * fVar154;
                        local_13e0._4_4_ = fVar161;
                        local_13e0._0_4_ = fVar155;
                        fVar98 = (auVar80._8_4_ * auVar81._8_4_ + auVar67._8_4_) * fVar154;
                        local_13e0._8_4_ = fVar98;
                        fVar99 = (auVar80._12_4_ * auVar81._12_4_ + auVar67._12_4_) * fVar154;
                        local_13e0._12_4_ = fVar99;
                        fVar100 = (auVar81._16_4_ * 0.0 + auVar67._16_4_) * fVar154;
                        local_13e0._16_4_ = fVar100;
                        fVar101 = (auVar81._20_4_ * 0.0 + auVar67._20_4_) * fVar154;
                        local_13e0._20_4_ = fVar101;
                        fVar102 = (auVar81._24_4_ * 0.0 + auVar67._24_4_) * fVar154;
                        local_13e0._24_4_ = fVar102;
                        local_13e0._28_4_ = fVar154;
                        auVar67 = vcvtdq2ps_avx(auVar15);
                        fVar103 = (auVar80._0_4_ * auVar67._0_4_ + auVar68._0_4_) * fVar153;
                        fVar109 = (auVar80._4_4_ * auVar67._4_4_ + auVar68._4_4_) * fVar153;
                        local_13c0._4_4_ = fVar109;
                        local_13c0._0_4_ = fVar103;
                        fVar110 = (auVar80._8_4_ * auVar67._8_4_ + auVar68._8_4_) * fVar153;
                        local_13c0._8_4_ = fVar110;
                        fVar111 = (auVar80._12_4_ * auVar67._12_4_ + auVar68._12_4_) * fVar153;
                        local_13c0._12_4_ = fVar111;
                        fVar112 = (auVar67._16_4_ * 0.0 + auVar68._16_4_) * fVar153;
                        local_13c0._16_4_ = fVar112;
                        fVar113 = (auVar67._20_4_ * 0.0 + auVar68._20_4_) * fVar153;
                        local_13c0._20_4_ = fVar113;
                        fVar114 = (auVar67._24_4_ * 0.0 + auVar68._24_4_) * fVar153;
                        local_13c0._24_4_ = fVar114;
                        local_13c0._28_4_ = fVar153;
                        pGVar4 = (local_15a8->geometries).items[local_1690].ptr;
                        if ((pGVar4->mask & *(uint *)(local_15c0 + local_15c8 * 4 + 0x120)) != 0) {
                          auVar129 = ZEXT3264(local_15a0);
                          auVar67 = vrcpps_avx(local_13a0);
                          auVar128._8_4_ = 0x3f800000;
                          auVar128._0_8_ = &DAT_3f8000003f800000;
                          auVar128._12_4_ = 0x3f800000;
                          auVar128._16_4_ = 0x3f800000;
                          auVar128._20_4_ = 0x3f800000;
                          auVar128._24_4_ = 0x3f800000;
                          auVar128._28_4_ = 0x3f800000;
                          auVar64 = vfnmadd213ps_fma(local_13a0,auVar67,auVar128);
                          auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar67,auVar67);
                          auVar121._8_4_ = 0x219392ef;
                          auVar121._0_8_ = 0x219392ef219392ef;
                          auVar121._12_4_ = 0x219392ef;
                          auVar121._16_4_ = 0x219392ef;
                          auVar121._20_4_ = 0x219392ef;
                          auVar121._24_4_ = 0x219392ef;
                          auVar121._28_4_ = 0x219392ef;
                          auVar67 = vcmpps_avx(local_1220,auVar121,5);
                          auVar67 = vandps_avx(auVar67,ZEXT1632(auVar64));
                          auVar36._4_4_ = fVar161 * auVar67._4_4_;
                          auVar36._0_4_ = fVar155 * auVar67._0_4_;
                          auVar36._8_4_ = fVar98 * auVar67._8_4_;
                          auVar36._12_4_ = fVar99 * auVar67._12_4_;
                          auVar36._16_4_ = fVar100 * auVar67._16_4_;
                          auVar36._20_4_ = fVar101 * auVar67._20_4_;
                          auVar36._24_4_ = fVar102 * auVar67._24_4_;
                          auVar36._28_4_ = fVar154;
                          local_1340 = vminps_avx(auVar36,auVar128);
                          auVar37._4_4_ = fVar109 * auVar67._4_4_;
                          auVar37._0_4_ = fVar103 * auVar67._0_4_;
                          auVar37._8_4_ = fVar110 * auVar67._8_4_;
                          auVar37._12_4_ = fVar111 * auVar67._12_4_;
                          auVar37._16_4_ = fVar112 * auVar67._16_4_;
                          auVar37._20_4_ = fVar113 * auVar67._20_4_;
                          auVar37._24_4_ = fVar114 * auVar67._24_4_;
                          auVar37._28_4_ = auVar67._28_4_;
                          local_1320 = vminps_avx(auVar37,auVar128);
                          auVar85._8_4_ = 0x7f800000;
                          auVar85._0_8_ = 0x7f8000007f800000;
                          auVar85._12_4_ = 0x7f800000;
                          auVar85._16_4_ = 0x7f800000;
                          auVar85._20_4_ = 0x7f800000;
                          auVar85._24_4_ = 0x7f800000;
                          auVar85._28_4_ = 0x7f800000;
                          auVar67 = vblendvps_avx(auVar85,local_15a0,local_1360);
                          auVar68 = vshufps_avx(auVar67,auVar67,0xb1);
                          auVar68 = vminps_avx(auVar67,auVar68);
                          auVar81 = vshufpd_avx(auVar68,auVar68,5);
                          auVar68 = vminps_avx(auVar68,auVar81);
                          auVar81 = vpermpd_avx2(auVar68,0x4e);
                          auVar68 = vminps_avx(auVar68,auVar81);
                          auVar68 = vcmpps_avx(auVar67,auVar68,0);
                          auVar81 = local_1360 & auVar68;
                          auVar67 = local_1360;
                          if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar81 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar81 >> 0x7f,0) != '\0') ||
                                (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar81 >> 0xbf,0) != '\0') ||
                              (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar81[0x1f] < '\0') {
                            auVar67 = vandps_avx(auVar68,local_1360);
                          }
                          uVar54 = vmovmskps_avx(auVar67);
                          uVar53 = 0;
                          for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
                            uVar53 = uVar53 + 1;
                          }
                          uVar55 = (ulong)uVar53;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            uVar52 = *(undefined4 *)(local_1340 + uVar55 * 4);
                            uVar1 = *(undefined4 *)(local_1320 + uVar55 * 4);
                            fVar154 = local_12c0[uVar55 - 8];
                            fVar153 = local_12c0[uVar55];
                            fVar155 = local_12a0[uVar55];
                            *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x100) =
                                 *(undefined4 *)(local_1300 + uVar55 * 4);
                            *(float *)(local_15c0 + local_15c8 * 4 + 0x180) = fVar154;
                            *(float *)(local_15c0 + local_15c8 * 4 + 0x1a0) = fVar153;
                            *(float *)(local_15c0 + local_15c8 * 4 + 0x1c0) = fVar155;
                            *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x1e0) = uVar52;
                            *(undefined4 *)(local_15c0 + local_15c8 * 4 + 0x200) = uVar1;
                            *(uint *)(local_15c0 + local_15c8 * 4 + 0x220) = local_1520._4_4_;
                            *(uint *)(local_15c0 + local_15c8 * 4 + 0x240) = local_1660._4_4_;
                            *(uint *)(local_15c0 + local_15c8 * 4 + 0x260) =
                                 context->user->instID[0];
                            *(uint *)(local_15c0 + local_15c8 * 4 + 0x280) =
                                 context->user->instPrimID[0];
                          }
                          else {
                            local_1660._0_4_ = local_1660._4_4_;
                            uStack_1658._0_4_ = local_1660._4_4_;
                            uStack_1658._4_4_ = local_1660._4_4_;
                            uStack_1650._0_4_ = local_1660._4_4_;
                            uStack_1650._4_4_ = local_1660._4_4_;
                            uStack_1648._0_4_ = local_1660._4_4_;
                            uStack_1648._4_4_ = local_1660._4_4_;
                            local_1520._0_4_ = local_1520._4_4_;
                            uStack_1518._0_4_ = local_1520._4_4_;
                            uStack_1518._4_4_ = local_1520._4_4_;
                            uStack_1510._0_4_ = local_1520._4_4_;
                            uStack_1510._4_4_ = local_1520._4_4_;
                            uStack_1508._0_4_ = local_1520._4_4_;
                            uStack_1508._4_4_ = local_1520._4_4_;
                            local_1440 = local_1360;
                            do {
                              uVar52 = *(undefined4 *)(pRVar50 + sVar49 * 4 + 0x100);
                              local_1060 = *(undefined4 *)(local_1340 + uVar55 * 4);
                              local_1040 = *(undefined4 *)(local_1320 + uVar55 * 4);
                              *(undefined4 *)(pRVar50 + sVar49 * 4 + 0x100) =
                                   *(undefined4 *)(local_1300 + uVar55 * 4);
                              fVar154 = local_12c0[uVar55 - 8];
                              auVar97._4_4_ = fVar154;
                              auVar97._0_4_ = fVar154;
                              auVar97._8_4_ = fVar154;
                              auVar97._12_4_ = fVar154;
                              auVar97._16_4_ = fVar154;
                              auVar97._20_4_ = fVar154;
                              auVar97._24_4_ = fVar154;
                              auVar97._28_4_ = fVar154;
                              fVar153 = local_12c0[uVar55];
                              local_10a0._4_4_ = fVar153;
                              local_10a0._0_4_ = fVar153;
                              local_10a0._8_4_ = fVar153;
                              local_10a0._12_4_ = fVar153;
                              local_10a0._16_4_ = fVar153;
                              local_10a0._20_4_ = fVar153;
                              local_10a0._24_4_ = fVar153;
                              local_10a0._28_4_ = fVar153;
                              fVar153 = local_12a0[uVar55];
                              local_1080._4_4_ = fVar153;
                              local_1080._0_4_ = fVar153;
                              local_1080._8_4_ = fVar153;
                              local_1080._12_4_ = fVar153;
                              local_1080._16_4_ = fVar153;
                              local_1080._20_4_ = fVar153;
                              local_1080._24_4_ = fVar153;
                              local_1080._28_4_ = fVar153;
                              local_1570.context = context->user;
                              local_10c0[0] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[1] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[2] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[3] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[4] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[5] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[6] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[7] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[8] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[9] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[10] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0xb] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[0xc] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[0xd] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[0xe] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0xf] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[0x10] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[0x11] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[0x12] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0x13] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[0x14] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[0x15] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[0x16] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0x17] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[0x18] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[0x19] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              local_10c0[0x1c] = (RTCHitN)SUB41(fVar154,0);
                              local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar154 >> 8);
                              local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar154 >> 0x10);
                              local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar154 >> 0x18);
                              uStack_105c = local_1060;
                              uStack_1058 = local_1060;
                              uStack_1054 = local_1060;
                              uStack_1050 = local_1060;
                              uStack_104c = local_1060;
                              uStack_1048 = local_1060;
                              uStack_1044 = local_1060;
                              uStack_103c = local_1040;
                              uStack_1038 = local_1040;
                              uStack_1034 = local_1040;
                              uStack_1030 = local_1040;
                              uStack_102c = local_1040;
                              uStack_1028 = local_1040;
                              uStack_1024 = local_1040;
                              local_1020 = local_1520;
                              uStack_1018 = uStack_1518;
                              uStack_1010 = uStack_1510;
                              uStack_1008 = uStack_1508;
                              local_1000 = local_1660;
                              uStack_ff8 = uStack_1658;
                              uStack_ff0 = uStack_1650;
                              uStack_fe8 = uStack_1648;
                              auVar67 = vpcmpeqd_avx2(auVar97,auVar97);
                              uStack_fdc = (local_1570.context)->instID[0];
                              local_fe0 = uStack_fdc;
                              uStack_fd8 = uStack_fdc;
                              uStack_fd4 = uStack_fdc;
                              uStack_fd0 = uStack_fdc;
                              uStack_fcc = uStack_fdc;
                              uStack_fc8 = uStack_fdc;
                              uStack_fc4 = uStack_fdc;
                              uStack_fbc = (local_1570.context)->instPrimID[0];
                              local_fc0 = uStack_fbc;
                              uStack_fb8 = uStack_fbc;
                              uStack_fb4 = uStack_fbc;
                              uStack_fb0 = uStack_fbc;
                              uStack_fac = uStack_fbc;
                              uStack_fa8 = uStack_fbc;
                              uStack_fa4 = uStack_fbc;
                              local_1420 = local_1280._0_8_;
                              uStack_1418 = local_1280._8_8_;
                              uStack_1410 = local_1280._16_8_;
                              uStack_1408 = local_1280._24_8_;
                              local_1570.valid = (int *)&local_1420;
                              local_1570.geometryUserPtr = pGVar4->userPtr;
                              local_1570.ray = (RTCRayN *)pRVar50;
                              local_1570.hit = local_10c0;
                              local_1570.N = 8;
                              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                local_1690 = CONCAT44(local_1690._4_4_,uVar52);
                                auVar67 = ZEXT1632(auVar67._0_16_);
                                (*pGVar4->intersectionFilterN)(&local_1570);
                                auVar129 = ZEXT3264(local_15a0);
                                auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                                uVar52 = (undefined4)local_1690;
                              }
                              auVar46._8_8_ = uStack_1418;
                              auVar46._0_8_ = local_1420;
                              auVar46._16_8_ = uStack_1410;
                              auVar46._24_8_ = uStack_1408;
                              auVar81 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                      auVar46);
                              auVar68 = auVar67 & ~auVar81;
                              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar68 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar68 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar68 >> 0x7f,0) == '\0')
                                    && (auVar68 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar68 >> 0xbf,0) == '\0')
                                  && (auVar68 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar68[0x1f]) {
                                auVar81 = auVar81 ^ auVar67;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  local_1690 = CONCAT44(local_1690._4_4_,uVar52);
                                  auVar67 = ZEXT1632(auVar67._0_16_);
                                  (*p_Var9)(&local_1570);
                                  auVar129 = ZEXT3264(local_15a0);
                                  auVar67 = vpcmpeqd_avx2(auVar67,auVar67);
                                  uVar52 = (undefined4)local_1690;
                                }
                                auVar47._8_8_ = uStack_1418;
                                auVar47._0_8_ = local_1420;
                                auVar47._16_8_ = uStack_1410;
                                auVar47._24_8_ = uStack_1408;
                                auVar15 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                        auVar47);
                                auVar81 = auVar15 ^ auVar67;
                                auVar68 = auVar67 & ~auVar15;
                                if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar68 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar68 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar68 >> 0x7f,0) != '\0')
                                      || (auVar68 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || SUB321(auVar68 >> 0xbf,0) != '\0'
                                     ) || (auVar68 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar68[0x1f] < '\0') {
                                  auVar86._0_4_ = auVar15._0_4_ ^ auVar67._0_4_;
                                  auVar86._4_4_ = auVar15._4_4_ ^ auVar67._4_4_;
                                  auVar86._8_4_ = auVar15._8_4_ ^ auVar67._8_4_;
                                  auVar86._12_4_ = auVar15._12_4_ ^ auVar67._12_4_;
                                  auVar86._16_4_ = auVar15._16_4_ ^ auVar67._16_4_;
                                  auVar86._20_4_ = auVar15._20_4_ ^ auVar67._20_4_;
                                  auVar86._24_4_ = auVar15._24_4_ ^ auVar67._24_4_;
                                  auVar86._28_4_ = auVar15._28_4_ ^ auVar67._28_4_;
                                  auVar67 = vmaskmovps_avx(auVar86,*(undefined1 (*) [32])
                                                                    local_1570.hit);
                                  *(undefined1 (*) [32])(local_1570.ray + 0x180) = auVar67;
                                  auVar67 = vmaskmovps_avx(auVar86,*(undefined1 (*) [32])
                                                                    (local_1570.hit + 0x20));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x1a0) = auVar67;
                                  auVar67 = vmaskmovps_avx(auVar86,*(undefined1 (*) [32])
                                                                    (local_1570.hit + 0x40));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x1c0) = auVar67;
                                  auVar67 = vmaskmovps_avx(auVar86,*(undefined1 (*) [32])
                                                                    (local_1570.hit + 0x60));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x1e0) = auVar67;
                                  auVar67 = vmaskmovps_avx(auVar86,*(undefined1 (*) [32])
                                                                    (local_1570.hit + 0x80));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x200) = auVar67;
                                  auVar67 = vpmaskmovd_avx2(auVar86,*(undefined1 (*) [32])
                                                                     (local_1570.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x220) = auVar67;
                                  auVar67 = vpmaskmovd_avx2(auVar86,*(undefined1 (*) [32])
                                                                     (local_1570.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x240) = auVar67;
                                  auVar67 = vpmaskmovd_avx2(auVar86,*(undefined1 (*) [32])
                                                                     (local_1570.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x260) = auVar67;
                                  auVar67 = vpmaskmovd_avx2(auVar86,*(undefined1 (*) [32])
                                                                     (local_1570.hit + 0x100));
                                  *(undefined1 (*) [32])(local_1570.ray + 0x280) = auVar67;
                                }
                              }
                              if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar81 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar81 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar81 >> 0x7f,0) == '\0')
                                    && (auVar81 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar81 >> 0xbf,0) == '\0')
                                  && (auVar81 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar81[0x1f]) {
                                *(undefined4 *)(pRVar50 + sVar49 * 4 + 0x100) = uVar52;
                              }
                              *(undefined4 *)(local_1440 + uVar55 * 4) = 0;
                              uVar52 = *(undefined4 *)(pRVar50 + sVar49 * 4 + 0x100);
                              auVar75._4_4_ = uVar52;
                              auVar75._0_4_ = uVar52;
                              auVar75._8_4_ = uVar52;
                              auVar75._12_4_ = uVar52;
                              auVar75._16_4_ = uVar52;
                              auVar75._20_4_ = uVar52;
                              auVar75._24_4_ = uVar52;
                              auVar75._28_4_ = uVar52;
                              auVar68 = vcmpps_avx(auVar129._0_32_,auVar75,2);
                              auVar67 = vandps_avx(auVar68,local_1440);
                              local_1440 = local_1440 & auVar68;
                              bVar44 = (local_1440 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar45 = (local_1440 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar43 = (local_1440 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0;
                              bVar42 = SUB321(local_1440 >> 0x7f,0) != '\0';
                              bVar41 = (local_1440 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0;
                              bVar40 = SUB321(local_1440 >> 0xbf,0) != '\0';
                              bVar39 = (local_1440 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0;
                              bVar38 = local_1440[0x1f] < '\0';
                              if (((((((bVar44 || bVar45) || bVar43) || bVar42) || bVar41) || bVar40
                                   ) || bVar39) || bVar38) {
                                auVar87._8_4_ = 0x7f800000;
                                auVar87._0_8_ = 0x7f8000007f800000;
                                auVar87._12_4_ = 0x7f800000;
                                auVar87._16_4_ = 0x7f800000;
                                auVar87._20_4_ = 0x7f800000;
                                auVar87._24_4_ = 0x7f800000;
                                auVar87._28_4_ = 0x7f800000;
                                auVar68 = vblendvps_avx(auVar87,auVar129._0_32_,auVar67);
                                auVar81 = vshufps_avx(auVar68,auVar68,0xb1);
                                auVar81 = vminps_avx(auVar68,auVar81);
                                auVar15 = vshufpd_avx(auVar81,auVar81,5);
                                auVar81 = vminps_avx(auVar81,auVar15);
                                auVar15 = vpermpd_avx2(auVar81,0x4e);
                                auVar81 = vminps_avx(auVar81,auVar15);
                                auVar81 = vcmpps_avx(auVar68,auVar81,0);
                                auVar15 = auVar67 & auVar81;
                                auVar68 = auVar67;
                                if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar15 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar15 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar15 >> 0x7f,0) != '\0')
                                      || (auVar15 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || SUB321(auVar15 >> 0xbf,0) != '\0'
                                     ) || (auVar15 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
                                  auVar68 = vandps_avx(auVar81,auVar67);
                                }
                                uVar54 = vmovmskps_avx(auVar68);
                                uVar53 = 0;
                                for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
                                  uVar53 = uVar53 + 1;
                                }
                                uVar55 = (ulong)uVar53;
                              }
                              local_1440 = auVar67;
                            } while (((((((bVar44 || bVar45) || bVar43) || bVar42) || bVar41) ||
                                      bVar40) || bVar39) || bVar38);
                          }
                        }
                      }
                    }
                  }
                }
                local_1680 = local_1680 - 1 & local_1680;
              } while (local_1680 != 0);
            }
            local_15d8 = local_15d8 + 1;
          } while (local_15d8 != local_1610);
        }
        iStack_1614 = *(int *)(ray + k * 4 + 0x100);
        auVar136 = ZEXT1664(local_14c0);
        auVar143 = ZEXT1664(local_14d0);
        auVar129 = ZEXT1664(local_1630);
        iStack_1618 = iStack_1614;
        iStack_161c = iStack_1614;
        local_1620 = iStack_1614;
        fVar154 = fStack_14e4;
        fVar153 = fStack_14e8;
        fVar155 = fStack_14ec;
        fVar161 = local_14f0;
        fVar98 = fStack_14d4;
        fVar99 = fStack_14d8;
        fVar100 = fStack_14dc;
        fVar101 = local_14e0;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }